

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_chain_add(llama_sampler *chain,llama_sampler *smpl)

{
  llama_sampler_context_t pvVar1;
  iterator __position;
  llama_sampler *local_8;
  
  pvVar1 = chain->ctx;
  __position._M_current = *(llama_sampler ***)((long)pvVar1 + 0x10);
  if (__position._M_current == *(llama_sampler ***)((long)pvVar1 + 0x18)) {
    local_8 = smpl;
    std::vector<llama_sampler*,std::allocator<llama_sampler*>>::
    _M_realloc_insert<llama_sampler*const&>
              ((vector<llama_sampler*,std::allocator<llama_sampler*>> *)((long)pvVar1 + 8),
               __position,&local_8);
  }
  else {
    *__position._M_current = smpl;
    *(long *)((long)pvVar1 + 0x10) = *(long *)((long)pvVar1 + 0x10) + 8;
  }
  return;
}

Assistant:

void llama_sampler_chain_add(struct llama_sampler * chain, struct llama_sampler * smpl) {
    auto * p = (llama_sampler_chain *) chain->ctx;
    p->samplers.push_back(smpl);
}